

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.cpp
# Opt level: O1

void __thiscall
Centaurus::CompositeATN<char>::build_closure_inclusive
          (CompositeATN<char> *this,CATNClosure *closure,ATNPath *path,int color,
          ATNStateStack *stack,PriorityChain *priority)

{
  pointer ppVar1;
  int iVar2;
  CATNNode<char> *pCVar3;
  SimpleException *this_00;
  int local_5c;
  ATNStateStack *local_58;
  undefined1 local_50 [16];
  _func_int *local_40 [2];
  
  local_5c = color;
  pCVar3 = get_node(this,path);
  if ((pCVar3->m_submachine).m_id._M_string_length == 0) {
    std::
    _Rb_tree<Centaurus::CATNClosureElement,Centaurus::CATNClosureElement,std::_Identity<Centaurus::CATNClosureElement>,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>
    ::_M_emplace_unique<Centaurus::ATNPath_const&,int&,Centaurus::PriorityChain_const&>
              ((_Rb_tree<Centaurus::CATNClosureElement,Centaurus::CATNClosureElement,std::_Identity<Centaurus::CATNClosureElement>,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>
                *)closure,path,&local_5c,priority);
    build_closure_exclusive(this,closure,path,local_5c,stack,priority);
  }
  else {
    ppVar1 = (path->
             super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
             ).
             super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_58 = stack;
    iVar2 = ATNPath::count(path,&ppVar1[-1].first,ppVar1[-1].second);
    if (1 < iVar2) {
      this_00 = (SimpleException *)__cxa_allocate_exception(0x28);
      local_50._0_8_ = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Downward sentinel reached.","");
      SimpleException::SimpleException(this_00,(string *)local_50);
      __cxa_throw(this_00,&SimpleException::typeinfo,SimpleException::~SimpleException);
    }
    ATNPath::add((ATNPath *)local_50,path,&pCVar3->m_submachine,0);
    build_closure_inclusive(this,closure,(ATNPath *)local_50,local_5c,local_58,priority);
    std::
    vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
    ::~vector((vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
               *)(local_50 + 8));
  }
  return;
}

Assistant:

void CompositeATN<TCHAR>::build_closure_inclusive(CATNClosure& closure, const ATNPath& path, int color, ATNStateStack& stack, const PriorityChain& priority) const
{
    const CATNNode<TCHAR>& node = get_node(path);

    if (node.is_terminal())
    {
        closure.emplace(path, color, priority);

        build_closure_exclusive(closure, path, color, stack, priority);
    }
    else
    {
        if (path.count(path.leaf_id(), path.leaf_index()) >= 2)
        {
            throw SimpleException("Downward sentinel reached.");
        }
        build_closure_inclusive(closure, path.add(node.get_submachine(), 0), color, stack, priority);
    }
}